

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O2

int __thiscall pg::PPSolver::getRegionStatus(PPSolver *this,int i,int p)

{
  int iVar1;
  int iVar2;
  Game *pGVar3;
  int *piVar4;
  uint uVar5;
  Error *this_00;
  int *piVar6;
  int *piVar7;
  int iVar8;
  ulong uVar9;
  int j;
  uint local_34;
  
  local_34 = p & 1;
  for (; (-1 < i && (uVar9 = (ulong)(uint)i, ((this->super_Solver).game)->_priority[uVar9] == p));
      i = i - 1) {
    if (((((this->super_Solver).disabled)->_bits[(uint)i >> 6] >> (uVar9 & 0x3f) & 1) == 0) &&
       (this->region[uVar9] <= p)) {
      uVar5 = Solver::owner(&this->super_Solver,i);
      if (uVar5 == local_34) {
        if (this->strategy[uVar9] == -1) {
          return -2;
        }
      }
      else {
        pGVar3 = (this->super_Solver).game;
        for (piVar6 = pGVar3->_outedges + pGVar3->_firstouts[uVar9]; uVar9 = (ulong)*piVar6,
            uVar9 != 0xffffffffffffffff; piVar6 = piVar6 + 1) {
          if (((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) &&
             (this->region[uVar9] < p)) {
            return -2;
          }
        }
      }
    }
  }
  piVar6 = this->regions[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = this->regions[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar8 = -1;
  do {
    if (piVar6 == piVar4) {
      return iVar8;
    }
    iVar1 = *piVar6;
    uVar5 = Solver::owner(&this->super_Solver,iVar1);
    if (uVar5 != local_34) {
      pGVar3 = (this->super_Solver).game;
      for (piVar7 = pGVar3->_outedges + pGVar3->_firstouts[iVar1]; uVar9 = (ulong)*piVar7,
          uVar9 != 0xffffffffffffffff; piVar7 = piVar7 + 1) {
        iVar1 = iVar8;
        if (((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) &&
           (((iVar2 = this->region[uVar9], iVar2 <= p ||
             (iVar1 = iVar2, iVar8 != -1 && iVar8 <= iVar2)) && (iVar1 = iVar8, iVar2 < p)))) {
          this_00 = (Error *)__cxa_allocate_exception(0x40);
          Error::Error(this_00,"logic error",
                       "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/pp.cpp"
                       ,0x108);
          __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
        }
        iVar8 = iVar1;
      }
    }
    piVar6 = piVar6 + 1;
  } while( true );
}

Assistant:

int
PPSolver::getRegionStatus(int i, int p)
{
    const int pl = p&1;

    // check if the region is closed in the subgame
    for (int j=i; j>=0 && priority(j)==p; j--) {
        if (disabled[j] or region[j] > p) {
            // escape not in region
            continue;
        } else if (owner(j) == pl) {
            // region won by escape owner
            // it is therefore closed if it has a strategy
            if (strategy[j] == -1) return -2;
        } else {
            // region lost by escape owner
            // it is therefore closed if there are no edges to lower regions
            for (auto curedge = outs(j); *curedge != -1; curedge++) {
                int to =*curedge;
                if (disabled[to]) continue;
                if (region[to] < p) return -2; // open
            }
        }
    }
    // closed in the subgame, so find lowest higher region for possible promotion
    int lowest = -1;
    for (int j : regions[p]) {
        if (owner(j) != pl) {
            // losing node, find lowest higher ...
            for (auto curedge = outs(j); *curedge != -1; curedge++) {
                int to = *curedge;
                /** HOT SPOT of the iterator and minor hot spot of obtaining the region **/
                if (disabled[to]) continue;
                int r = region[to];
                if (r > p && (r < lowest || lowest == -1)) lowest = r;
                else if (r < p) LOGIC_ERROR;
            }
        }
    }
    return lowest; // -1 if dominion, <region> otherwise
}